

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O0

const_iterator __thiscall
mapbox::eternal::impl::
map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
::find(map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
       *this,key_type *key)

{
  bool local_3a;
  greater_equal local_39;
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *local_38
  ;
  element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *it;
  compare_key_type compare_key;
  key_type *key_local;
  map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
  *this_local;
  
  compare_key.hash = (size_t)key;
  compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_>::compare_key_hash
            ((compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_> *)&it,
             key);
  local_38 = bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element_hash<mapbox::eternal::string,unsigned_int,std::hash<mapbox::eternal::string>>const*,mapbox::eternal::impl::compare_key_hash<mapbox::eternal::string,std::hash<mapbox::eternal::string>>>
                       (this->data_,this[1].data_,
                        (compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_>
                         *)&it);
  local_3a = false;
  if (local_38 != this[1].data_) {
    local_3a = greater_equal::operator()
                         (&local_39,local_38,
                          (compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_>
                           *)&it);
  }
  if (local_3a == false) {
    this_local = (map<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>,_22UL>
                  *)end(this);
  }
  else {
    iterator<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>_>
    ::iterator((iterator<mapbox::eternal::impl::element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>_>
                *)&this_local,local_38);
  }
  return (const_iterator)this_local->data_;
}

Assistant:

find(const key_type& key) const noexcept {
        const compare_key_type compare_key{ key };
        auto it = bound<less>(data_, data_ + N, compare_key);
        if (it != data_ + N && greater_equal()(*it, compare_key)) {
            return it;
        } else {
            return end();
        }
    }